

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPTP.hpp
# Opt level: O2

char __thiscall Parse::TPTP::getChar(TPTP *this,int pos)

{
  int iVar1;
  char *pcVar2;
  char cVar3;
  
  while (this->_cend <= pos) {
    iVar1 = std::istream::get();
    cVar3 = (char)iVar1;
    if (iVar1 == -1) {
      cVar3 = '\0';
    }
    iVar1 = this->_cend;
    this->_cend = iVar1 + 1;
    pcVar2 = Lib::Array<char>::operator[](&this->_chars,(long)iVar1);
    *pcVar2 = cVar3;
  }
  pcVar2 = Lib::Array<char>::operator[](&this->_chars,(long)pos);
  return *pcVar2;
}

Assistant:

inline char getChar(int pos)
  {
    while (_cend <= pos) {
      int c = currentFile.in->get();
      //      if (c == -1) { std::cout << "<EOF>"; } else {std::cout << char(c);}
      _chars[_cend++] = c == -1 ? 0 : c;
    }
    return _chars[pos];
  }